

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O1

CFG * __thiscall PDA::toCFG(PDA *this)

{
  CFG *this_00;
  PDA *this_01;
  vector<Production_*,_std::allocator<Production_*>_> r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strVec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  vector<char,_std::allocator<char>_> local_98;
  vector<Production_*,_std::allocator<Production_*>_> local_80;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  
  getCFGVariables_abi_cxx11_(&local_30,this);
  getCFGProductions(&local_80,this);
  this_01 = (PDA *)&this->inputAlphabetS;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_98,(vector<char,_std::allocator<char>_> *)this_01);
  toVecStr_abi_cxx11_(&local_48,this_01,&local_98);
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  this_00 = (CFG *)operator_new(0x68);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"S","");
  CFG::CFG(this_00,&local_30,&local_48,&local_80,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_80.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<Production_*,_std::allocator<Production_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_30);
  return this_00;
}

Assistant:

CFG *PDA::toCFG() {
    std::vector<std::string> v = getCFGVariables(); // set of variables
    std::vector<Production*> r = getCFGProductions();

    std::vector<std::string> strVec = toVecStr(inputAlphabetS);
    CFG* cfg = new CFG(v, strVec, r, "S");
    return cfg;
}